

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O2

string * generateCopyrightMessage(string *__return_storage_ptr__,string *comment)

{
  size_type sVar1;
  string local_70;
  string copyrightMessage;
  
  std::__cxx11::string::string((string *)&copyrightMessage,comment);
  sVar1 = 0;
  while( true ) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&copyrightMessage,'\n',sVar1);
    if (sVar1 == 0xffffffffffffffff) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (&copyrightMessage,sVar1,1,"\n// ");
    sVar1 = sVar1 + 1;
  }
  trimEnd(&local_70,&copyrightMessage);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&copyrightMessage,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&copyrightMessage,
             "\n\n// This header is generated from the Khronos Vulkan XML API Registry.");
  trim(&local_70,&copyrightMessage);
  std::operator+(__return_storage_ptr__,&local_70,"\n");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&copyrightMessage);
  return __return_storage_ptr__;
}

Assistant:

inline std::string generateCopyrightMessage( std::string const & comment )
{
  std::string copyrightMessage = comment;

  // replace any '\n' with "\n// "
  for ( size_t pos = copyrightMessage.find( '\n' ); pos != std::string::npos; pos = copyrightMessage.find( '\n', pos + 1 ) )
  {
    copyrightMessage.replace( pos, 1, "\n// " );
  }
  // remove any trailing spaces
  copyrightMessage = trimEnd( copyrightMessage );

  // and add a little message on our own
  copyrightMessage += "\n\n// This header is generated from the Khronos Vulkan XML API Registry.";
  return trim( copyrightMessage ) + "\n";
}